

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O0

int AF_A_FireArrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *source;
  DObject *this;
  int iVar1;
  bool bVar2;
  double dVar3;
  bool local_77;
  bool local_72;
  bool local_6f;
  FSoundID local_6c;
  AWeapon *local_68;
  AWeapon *weapon;
  DAngle savedangle;
  MetaClass *ti;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  source = (AActor *)(param->field_0).field_1.a;
  local_6f = true;
  if (source != (AActor *)0x0) {
    local_6f = DObject::IsKindOf((DObject *)source,AActor::RegistrationInfo.MyClass);
  }
  if (local_6f == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
      bVar2 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this = (DObject *)param[1].field_0.field_1.a;
    local_72 = true;
    if (this != (DObject *)0x0) {
      local_72 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_72 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar2 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
      bVar2 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar2) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                    ,0xfb,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0xfc,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if ((param[3].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[3].field_0.field_1.atag != 1)) {
    bVar2 = param[3].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    savedangle.Degrees = *(double *)&param[3].field_0;
    local_77 = true;
    if ((PClass *)savedangle.Degrees != (PClass *)0x0) {
      local_77 = PClass::IsDescendantOf
                           ((PClass *)savedangle.Degrees,AActor::RegistrationInfo.MyClass);
    }
    if (local_77 != false) {
      TAngle<double>::TAngle((TAngle<double> *)&weapon);
      if ((source->player != (player_t *)0x0) &&
         (((local_68 = source->player->ReadyWeapon, local_68 == (AWeapon *)0x0 ||
           (bVar2 = AWeapon::DepleteAmmo(local_68,(bool)(local_68->bAltFire & 1),true,-1), bVar2))
          && (savedangle.Degrees != 0.0)))) {
        TAngle<double>::operator=((TAngle<double> *)&weapon,&(source->Angles).Yaw);
        iVar1 = FRandom::Random2(&pr_electric);
        dVar3 = AActor::AccuracyFactor(&source->player->mo->super_AActor);
        TAngle<double>::operator+=(&(source->Angles).Yaw,(double)iVar1 * 0.02197265625 * dVar3);
        APlayerPawn::PlayAttacking2(source->player->mo);
        P_SpawnPlayerMissile(source,(PClassActor *)savedangle.Degrees);
        TAngle<double>::operator=(&(source->Angles).Yaw,(TAngle<double> *)&weapon);
        FSoundID::FSoundID(&local_6c,"weapons/xbowshoot");
        S_Sound(source,1,&local_6c,1.0,1.0);
      }
      return 0;
    }
    __assert_fail("ti == NULL || ti->IsDescendantOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                  ,0xfc,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0xfc,"int AF_A_FireArrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_FireArrow)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_CLASS(ti, AActor);

	DAngle savedangle;

	if (self->player == NULL)
		return 0;

	AWeapon *weapon = self->player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire))
			return 0;
	}

	if (ti) 
	{
		savedangle = self->Angles.Yaw;
		self->Angles.Yaw += pr_electric.Random2() * (5.625/256) * self->player->mo->AccuracyFactor();
		self->player->mo->PlayAttacking2 ();
		P_SpawnPlayerMissile (self, ti);
		self->Angles.Yaw = savedangle;
		S_Sound (self, CHAN_WEAPON, "weapons/xbowshoot", 1, ATTN_NORM);
	}
	return 0;
}